

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O2

bool DoDehPatch(void)

{
  Variant *pVVar1;
  uint uVar2;
  char *__s1;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  FStringTable *this;
  DObject *p;
  size_t sVar8;
  PClassActor *this_00;
  PClass *pPVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  FString name;
  FName local_140;
  FName local_13c;
  PFunction *sym;
  FScanner sc;
  
  if (!batchrun) {
    Printf("Adding dehacked patch %s\n",PatchName);
  }
  pcVar13 = PatchFile;
  pversion = -1;
  dversion = -1;
  iVar4 = strncmp(PatchFile,"Patch File for DeHackEd v",0x19);
  iVar5 = 3;
  if (iVar4 == 0) {
    if ((pcVar13[0x19] < '2') && (pcVar13[0x1b] != '3')) {
      Printf(200,"\"%s\" is an old and unsupported DeHackEd patch\n",PatchName);
      goto LAB_00430623;
    }
    uVar11 = 0;
    uVar7 = (ulong)(uint)PatchSize;
    if (PatchSize < 1) {
      uVar7 = uVar11;
    }
    for (; uVar7 != uVar11; uVar11 = uVar11 + 1) {
      if (pcVar13[uVar11] == '\0') {
        pcVar13[uVar11] = ' ';
      }
    }
    PatchPt = strchr(pcVar13,10);
    uVar7 = 0xffffffff;
    iVar5 = -1;
    while (iVar4 = GetLine(), __s1 = Line1, iVar4 == 1) {
      iVar4 = strcasecmp(Line1,"Doom version");
      if (iVar4 == 0) {
        dversion = atoi(Line2);
        iVar5 = dversion;
      }
      else {
        iVar4 = strcasecmp(__s1,"Patch format");
        if (iVar4 == 0) {
          pversion = atoi(Line2);
          uVar7 = (ulong)(uint)pversion;
        }
      }
    }
    if (((int)uVar7 == -1 || iVar5 == -1) || iVar4 == 0) {
      if (PatchName != (char *)0x0) {
        operator_delete__(PatchName);
        pcVar13 = PatchFile;
      }
      if (pcVar13 == (char *)0x0) {
        pcVar13 = (char *)0x0;
      }
      else {
        operator_delete__(pcVar13);
        pcVar13 = PatchFile;
      }
      Printf(200,"\"%s\" is not a DeHackEd patch file\n",pcVar13);
      return false;
    }
    if ((int)uVar7 - 7U < 0xfffffffe) {
      Printf("DeHackEd patch version is %d.\nUnexpected results may occur.\n",uVar7);
      iVar5 = dversion;
    }
    switch(iVar5) {
    case 0x10:
      iVar5 = 0;
      break;
    case 0x11:
      iVar5 = 2;
      break;
    default:
      Printf("Patch created with unknown DOOM version.\nAssuming version 1.9.\n");
    case 0x13:
      iVar5 = 3;
      break;
    case 0x14:
      iVar5 = 1;
      break;
    case 0x15:
      iVar5 = 4;
    }
  }
  else {
    DPrintf(2,"Patch does not have DeHackEd signature. Assuming .bex\n");
    dversion = 0x13;
    pversion = 6;
    PatchPt = PatchFile;
    do {
      iVar4 = GetLine();
    } while (iVar4 == 1);
  }
  dversion = iVar5;
  iVar5 = FWadCollection::CheckNumForName(&Wads,"DEHSUPP");
  if (iVar5 != -1) {
    iVar6 = FWadCollection::GetLumpFile(&Wads,iVar5);
    if (iVar6 < 1) {
      iVar6 = DehUseCount + 1;
      bVar3 = DehUseCount < 1;
      DehUseCount = iVar6;
      if (bVar3) {
        if (EnglishStrings == (FStringTable *)0x0) {
          this = (FStringTable *)operator_new(0x400);
          FStringTable::FStringTable(this);
          EnglishStrings = this;
          FStringTable::LoadStrings(this,true);
        }
        uVar2 = sprites.Count;
        if (UnchangedSpriteNames == (char *)0x0) {
          UnchangedSpriteNames = (char *)operator_new__((ulong)(sprites.Count * 4));
          NumUnchangedSprites = uVar2;
          lVar10 = 0;
          for (lVar12 = 0; lVar12 < NumUnchangedSprites; lVar12 = lVar12 + 1) {
            *(undefined4 *)(UnchangedSpriteNames + lVar12 * 4) =
                 *(undefined4 *)((long)&(sprites.Array)->field_0 + lVar10);
            lVar10 = lVar10 + 0xc;
          }
        }
        FScanner::FScanner(&sc);
        FScanner::OpenLumpNum(&sc,iVar5);
        FScanner::SetCMode(&sc,true);
        while (bVar3 = FScanner::GetString(&sc), bVar3) {
          bVar3 = FScanner::Compare(&sc,"ActionList");
          if (bVar3) {
            FScanner::MustGetStringName(&sc,"{");
            while (bVar3 = FScanner::CheckString(&sc,"}"), !bVar3) {
              FScanner::MustGetString(&sc);
              bVar3 = FScanner::Compare(&sc,"NULL");
              if (bVar3) {
                name.Chars = (char *)0x0;
                TArray<PFunction_*,_PFunction_*>::Push(&Actions,(PFunction **)&name);
              }
              else {
                FString::FString(&name,"A_");
                FString::operator+=(&name,sc.String);
                pPVar9 = AInventory::RegistrationInfo.MyClass;
                FName::FName(&local_13c,&name);
                p = &PSymbolTable::FindSymbol
                               (&(pPVar9->super_PStruct).super_PNamedType.super_PCompoundType.
                                 super_PType.Symbols,&local_13c,true)->super_DObject;
                sym = dyn_cast<PFunction>(p);
                if (sym == (PFunction *)0x0) {
                  FScanner::ScriptError(&sc,"Unknown code pointer \'%s\'",sc.String);
                }
                else if (((~sym->Flags & 6) != 0) ||
                        ((pVVar1 = (sym->Variants).Array, 3 < (pVVar1->ArgFlags).Count &&
                         (((pVVar1->ArgFlags).Array[3] & 1) == 0)))) {
                  FScanner::ScriptMessage(&sc,"Incompatible code pointer \'%s\'",sc.String);
                }
                TArray<PFunction_*,_PFunction_*>::Push(&Actions,&sym);
                FString::~FString(&name);
              }
              bVar3 = FScanner::CheckString(&sc,"}");
              if (bVar3) break;
              FScanner::MustGetStringName(&sc,",");
            }
          }
          else {
            bVar3 = FScanner::Compare(&sc,"OrgHeights");
            if (bVar3) {
              FScanner::MustGetStringName(&sc,"{");
              while (bVar3 = FScanner::CheckString(&sc,"}"), !bVar3) {
                FScanner::MustGetNumber(&sc);
                TArray<int,_int>::Push(&OrgHeights,&sc.Number);
                bVar3 = FScanner::CheckString(&sc,"}");
                if (bVar3) break;
                FScanner::MustGetStringName(&sc,",");
              }
            }
            else {
              bVar3 = FScanner::Compare(&sc,"CodePConv");
              if (bVar3) {
                FScanner::MustGetStringName(&sc,"{");
                while (bVar3 = FScanner::CheckString(&sc,"}"), !bVar3) {
                  FScanner::MustGetNumber(&sc);
                  TArray<int,_int>::Push(&CodePConv,&sc.Number);
                  bVar3 = FScanner::CheckString(&sc,"}");
                  if (bVar3) break;
                  FScanner::MustGetStringName(&sc,",");
                }
              }
              else {
                bVar3 = FScanner::Compare(&sc,"OrgSprNames");
                if (bVar3) {
                  FScanner::MustGetStringName(&sc,"{");
                  while (bVar3 = FScanner::CheckString(&sc,"}"), !bVar3) {
                    FScanner::MustGetString(&sc);
                    pcVar13 = sc.String;
                    name.Chars = name.Chars & 0xffffff0000000000;
                    sVar8 = strlen(sc.String);
                    if (sVar8 == 4) {
                      name.Chars._4_1_ = 0;
                      name.Chars._0_4_ = *(uint *)pcVar13;
                    }
                    else {
                      FScanner::ScriptError
                                (&sc,"Invalid sprite name \'%s\' (must be 4 characters)",pcVar13);
                    }
                    TArray<DEHSprName,_DEHSprName>::Push(&OrgSprNames,(DEHSprName *)&name);
                    bVar3 = FScanner::CheckString(&sc,"}");
                    if (bVar3) break;
                    FScanner::MustGetStringName(&sc,",");
                  }
                }
                else {
                  bVar3 = FScanner::Compare(&sc,"StateMap");
                  uVar2 = StateMap.Count;
                  if (bVar3) {
                    FScanner::MustGetStringName(&sc,"{");
                    while (bVar3 = FScanner::CheckString(&sc,"}"), !bVar3) {
                      FScanner::MustGetString(&sc);
                      this_00 = (PClassActor *)PClass::FindClass(sc.String);
                      pcVar13 = "Can\'t find type %s";
                      if (this_00 == (PClassActor *)0x0) {
LAB_00430b66:
                        FScanner::ScriptError(&sc,pcVar13,sc.String);
                      }
                      else {
                        bVar3 = DObject::IsKindOf((DObject *)this_00,
                                                  PClassActor::RegistrationInfo.MyClass);
                        pcVar13 = "%s is not an actor";
                        if (!bVar3) goto LAB_00430b66;
                      }
                      FScanner::MustGetStringName(&sc,",");
                      FScanner::MustGetString(&sc);
                      FName::FName(&local_140,sc.String);
                      name.Chars = (char *)PClassActor::FindState(this_00,&local_140);
                      if ((FState *)name.Chars == (FState *)0x0) {
                        FScanner::ScriptError
                                  (&sc,"Invalid state \'%s\' in \'%s\'",sc.String,
                                   FName::NameData.NameArray
                                   [(this_00->super_PClass).super_PStruct.super_PNamedType.TypeName.
                                    Index].Text);
                      }
                      FScanner::MustGetStringName(&sc,",");
                      FScanner::MustGetNumber(&sc);
                      if ((name.Chars == (char *)0x0) ||
                         (this_00->OwnedStates + this_00->NumOwnedStates <
                          (FState *)(name.Chars + (long)sc.Number * 0x28))) {
                        FScanner::ScriptError
                                  (&sc,"Invalid state range in \'%s\'",
                                   FName::NameData.NameArray
                                   [(this_00->super_PClass).super_PStruct.super_PNamedType.TypeName.
                                    Index].Text);
                      }
                      if (uVar2 == 0) {
                        TArray<StateMapper,_StateMapper>::Push(&StateMap,(StateMapper *)&name);
                      }
                      bVar3 = FScanner::CheckString(&sc,"}");
                      if (bVar3) break;
                      FScanner::MustGetStringName(&sc,",");
                    }
                  }
                  else {
                    bVar3 = FScanner::Compare(&sc,"SoundMap");
                    if (bVar3) {
                      FScanner::MustGetStringName(&sc,"{");
                      while (bVar3 = FScanner::CheckString(&sc,"}"), !bVar3) {
                        FScanner::MustGetString(&sc);
                        iVar5 = S_FindSound(sc.String);
                        name.Chars._0_4_ = iVar5;
                        TArray<FSoundID,_FSoundID>::Push(&SoundMap,(FSoundID *)&name);
                        bVar3 = FScanner::CheckString(&sc,"}");
                        if (bVar3) break;
                        FScanner::MustGetStringName(&sc,",");
                      }
                    }
                    else {
                      bVar3 = FScanner::Compare(&sc,"InfoNames");
                      if (bVar3) {
                        FScanner::MustGetStringName(&sc,"{");
                        while (bVar3 = FScanner::CheckString(&sc,"}"), !bVar3) {
                          FScanner::MustGetString(&sc);
                          name.Chars = (char *)PClass::FindActor(sc.String);
                          if ((PClassActor *)name.Chars == (PClassActor *)0x0) {
                            FScanner::ScriptError(&sc,"Unknown actor type \'%s\'",sc.String);
                          }
                          TArray<PClassActor_*,_PClassActor_*>::Push
                                    (&InfoNames,(PClassActor **)&name);
                          bVar3 = FScanner::CheckString(&sc,"}");
                          if (bVar3) break;
                          FScanner::MustGetStringName(&sc,",");
                        }
                      }
                      else {
                        bVar3 = FScanner::Compare(&sc,"ThingBits");
                        if (bVar3) {
                          FScanner::MustGetStringName(&sc,"{");
                          while (bVar3 = FScanner::CheckString(&sc,"}"), !bVar3) {
                            FScanner::MustGetNumber(&sc);
                            if (0x1f < (uint)sc.Number) {
                              FScanner::ScriptError(&sc,"Invalid bit value %d");
                            }
                            FScanner::MustGetStringName(&sc,",");
                            FScanner::MustGetNumber(&sc);
                            if (2 < (uint)sc.Number) {
                              FScanner::ScriptError(&sc,"Invalid flag word %d");
                            }
                            FScanner::MustGetStringName(&sc,",");
                            FScanner::MustGetString(&sc);
                            strncpy((char *)&name,sc.String,0x13);
                            TArray<BitName,_BitName>::Push(&BitNames,(BitName *)&name);
                            bVar3 = FScanner::CheckString(&sc,"}");
                            if (bVar3) break;
                            FScanner::MustGetStringName(&sc,",");
                          }
                        }
                        else {
                          bVar3 = FScanner::Compare(&sc,"RenderStyles");
                          if (bVar3) {
                            FScanner::MustGetStringName(&sc,"{");
                            while (bVar3 = FScanner::CheckString(&sc,"}"), !bVar3) {
                              FScanner::MustGetNumber(&sc);
                              FScanner::MustGetStringName(&sc,",");
                              FScanner::MustGetString(&sc);
                              strncpy((char *)&name,sc.String,0x13);
                              TArray<StyleName,_StyleName>::Push(&StyleNames,(StyleName *)&name);
                              bVar3 = FScanner::CheckString(&sc,"}");
                              if (bVar3) break;
                              FScanner::MustGetStringName(&sc,",");
                            }
                          }
                          else {
                            bVar3 = FScanner::Compare(&sc,"AmmoNames");
                            if (bVar3) {
                              FScanner::MustGetStringName(&sc,"{");
                              while (bVar3 = FScanner::CheckString(&sc,"}"), !bVar3) {
                                FScanner::MustGetString(&sc);
                                bVar3 = FScanner::Compare(&sc,"NULL");
                                if (bVar3) {
                                  name.Chars = (char *)0x0;
                                  TArray<PClassAmmo_*,_PClassAmmo_*>::Push
                                            (&AmmoNames,(PClassAmmo **)&name);
                                }
                                else {
                                  pPVar9 = PClass::FindClass(sc.String);
                                  name.Chars = (char *)dyn_cast<PClassAmmo>((DObject *)pPVar9);
                                  if ((PClassAmmo *)name.Chars == (PClassAmmo *)0x0) {
                                    FScanner::ScriptError(&sc,"Unknown ammo type \'%s\'",sc.String);
                                  }
                                  TArray<PClassAmmo_*,_PClassAmmo_*>::Push
                                            (&AmmoNames,(PClassAmmo **)&name);
                                }
                                bVar3 = FScanner::CheckString(&sc,"}");
                                if (bVar3) break;
                                FScanner::MustGetStringName(&sc,",");
                              }
                            }
                            else {
                              bVar3 = FScanner::Compare(&sc,"WeaponNames");
                              if (bVar3) {
                                TArray<PClassActor_*,_PClassActor_*>::Clear(&WeaponNames);
                                FScanner::MustGetStringName(&sc,"{");
                                while (bVar3 = FScanner::CheckString(&sc,"}"), !bVar3) {
                                  FScanner::MustGetString(&sc);
                                  pPVar9 = PClass::FindClass(sc.String);
                                  if ((pPVar9 == (PClass *)0x0) ||
                                     (bVar3 = PClass::IsAncestorOf
                                                        (AWeapon::RegistrationInfo.MyClass,pPVar9),
                                     !bVar3)) {
                                    FScanner::ScriptError
                                              (&sc,"Unknown weapon type \'%s\'",sc.String);
                                  }
                                  name.Chars = (char *)pPVar9;
                                  TArray<PClassActor_*,_PClassActor_*>::Push
                                            (&WeaponNames,(PClassActor **)&name);
                                  bVar3 = FScanner::CheckString(&sc,"}");
                                  if (bVar3) break;
                                  FScanner::MustGetStringName(&sc,",");
                                }
                              }
                              else {
                                bVar3 = FScanner::Compare(&sc,"Aliases");
                                if (bVar3) {
                                  FScanner::MustGetStringName(&sc,"{");
                                  while (bVar3 = FScanner::CheckString(&sc,"}"), !bVar3) {
                                    name.Chars = name.Chars & 0xffffffff00000000;
                                    FScanner::MustGetString(&sc);
                                    strncpy((char *)((long)&name.Chars + 4),sc.String,0x13);
                                    FScanner::MustGetStringName(&sc,",");
                                    FScanner::MustGetString(&sc);
                                    FName::operator=((FName *)&name,sc.String);
                                    FScanner::MustGetStringName(&sc,",");
                                    FScanner::MustGetNumber(&sc);
                                    TArray<CodePointerAlias,_CodePointerAlias>::Push
                                              (&MBFCodePointers,(CodePointerAlias *)&name);
                                    bVar3 = FScanner::CheckString(&sc,"}");
                                    if (bVar3) break;
                                    FScanner::MustGetStringName(&sc,",");
                                  }
                                }
                                else {
                                  FScanner::ScriptError(&sc,"Unknown section \'%s\'",sc.String);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          FScanner::MustGetStringName(&sc,";");
        }
        FScanner::~FScanner(&sc);
      }
LAB_00431248:
      pcVar13 = Line1;
      if (iVar4 == 2) {
        iVar5 = atoi(Line2);
        lVar10 = 0;
LAB_0043126b:
        lVar12 = lVar10;
        if (lVar12 + 0x10 != 0x100) goto code_r0x00431278;
        Printf("Unknown chunk %s encountered. Skipping.\n",pcVar13);
        do {
          iVar4 = GetLine();
        } while (iVar4 == 1);
        goto LAB_004312ad;
      }
      if (iVar4 != 1) goto LAB_004312ad;
      Printf("Key %s encountered out of context\n",Line1);
      goto LAB_004312c8;
    }
    Printf("Warning: DEHSUPP no longer supported. DEHACKED patch disabled.\n");
  }
  Printf("Could not load DEH support data\n");
  UnloadDehSupp();
LAB_00430623:
  if (PatchName != (char *)0x0) {
    operator_delete__(PatchName);
  }
  if (PatchFile != (char *)0x0) {
    operator_delete__(PatchFile);
  }
  return false;
code_r0x00431278:
  iVar4 = strcasecmp(*(char **)((long)&Modes[0].name + lVar12),pcVar13);
  lVar10 = lVar12 + 0x10;
  if (iVar4 == 0) goto code_r0x0043128b;
  goto LAB_0043126b;
code_r0x0043128b:
  iVar4 = (**(code **)((long)&Modes[0].func + lVar12))(iVar5);
LAB_004312ad:
  if (iVar4 == 0) {
LAB_004312c8:
    UnloadDehSupp();
    if (PatchName != (char *)0x0) {
      operator_delete__(PatchName);
    }
    if (PatchFile != (char *)0x0) {
      operator_delete__(PatchFile);
    }
    if (batchrun != false) {
      return true;
    }
    Printf("Patch installed\n");
    return true;
  }
  goto LAB_00431248;
}

Assistant:

static bool DoDehPatch()
{
	if (!batchrun) Printf("Adding dehacked patch %s\n", PatchName);

	int cont;

	dversion = pversion = -1;
	cont = 0;
	if (0 == strncmp (PatchFile, "Patch File for DeHackEd v", 25))
	{
		if (PatchFile[25] < '3' && PatchFile[25] != '2' && PatchFile[27] != '3')
		{
			Printf (PRINT_BOLD, "\"%s\" is an old and unsupported DeHackEd patch\n", PatchName);
			delete[] PatchName;
			delete[] PatchFile;
			return false;
		}
		// fix for broken WolfenDoom patches which contain \0 characters in some places.
		for (int i = 0; i < PatchSize; i++)
		{
			if (PatchFile[i] == 0) PatchFile[i] = ' ';	
		}

		PatchPt = strchr (PatchFile, '\n');
		while ((cont = GetLine()) == 1)
		{
				 CHECKKEY ("Doom version", dversion)
			else CHECKKEY ("Patch format", pversion)
		}
		if (!cont || dversion == -1 || pversion == -1)
		{
			delete[] PatchName;
			delete[] PatchFile;
			Printf (PRINT_BOLD, "\"%s\" is not a DeHackEd patch file\n", PatchFile);
			return false;
		}
	}
	else
	{
		DPrintf (DMSG_WARNING, "Patch does not have DeHackEd signature. Assuming .bex\n");
		dversion = 19;
		pversion = 6;
		PatchPt = PatchFile;
		while ((cont = GetLine()) == 1)
		{}
	}

	if (pversion != 5 && pversion != 6)
	{
		Printf ("DeHackEd patch version is %d.\nUnexpected results may occur.\n", pversion);
	}

	if (dversion == 16)
		dversion = 0;
	else if (dversion == 17)
		dversion = 2;
	else if (dversion == 19)
		dversion = 3;
	else if (dversion == 20)
		dversion = 1;
	else if (dversion == 21)
		dversion = 4;
	else
	{
		Printf ("Patch created with unknown DOOM version.\nAssuming version 1.9.\n");
		dversion = 3;
	}

	if (!LoadDehSupp ())
	{
		Printf ("Could not load DEH support data\n");
		UnloadDehSupp ();
		delete[] PatchName;
		delete[] PatchFile;
		return false;
	}

	do
	{
		if (cont == 1)
		{
			Printf ("Key %s encountered out of context\n", Line1);
			cont = 0;
		}
		else if (cont == 2)
		{
			cont = HandleMode (Line1, atoi (Line2));
		}
	} while (cont);

	UnloadDehSupp ();
	delete[] PatchName;
	delete[] PatchFile;
	if (!batchrun) Printf ("Patch installed\n");
	return true;
}